

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_194fe6::OwnershipAnalysis::establishOwnerships(OwnershipAnalysis *this)

{
  BuildFileDelegate *pBVar1;
  Command *pCVar2;
  bool bVar3;
  uint uVar4;
  reference ppVar5;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_88
  ;
  undefined1 local_70 [8];
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  conflictingProducers;
  BuildNode *local_48;
  Command *owner;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> outputNodeAndCommand;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  *__range2;
  OwnershipAnalysis *this_local;
  
  __end2 = std::
           vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ::begin(&this->outputNodesAndCommands);
  outputNodeAndCommand.second =
       (Command *)
       std::
       vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
       ::end(&this->outputNodesAndCommands);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
                                *)&outputNodeAndCommand.second);
    if (!bVar3) {
      return true;
    }
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
             ::operator*(&__end2);
    owner = (Command *)ppVar5->first;
    outputNodeAndCommand.first = (BuildNode *)ppVar5->second;
    uVar4 = (*((outputNodeAndCommand.first)->super_Node)._vptr_Node[0x12])();
    if (((uVar4 & 1) == 0) ||
       (((ulong)((outputNodeAndCommand.first)->mustScanAfterPaths).
                super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 1)) {
      setExcludedOwner(this,(BuildNode *)owner,(Command *)outputNodeAndCommand.first);
    }
    else {
      join_0x00000010_0x00000000_ = llbuild::buildsystem::Node::getName((Node *)owner);
      local_48 = (BuildNode *)includedOwnerOf(this,join_0x00000010_0x00000000_);
      if (local_48 == (BuildNode *)0x0) {
        setOwner(this,(BuildNode *)owner,(Command *)outputNodeAndCommand.first);
      }
      else if (local_48 != outputNodeAndCommand.first) {
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                *)local_70);
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        push_back((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                   *)local_70,(value_type *)&outputNodeAndCommand);
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        push_back((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                   *)local_70,(value_type *)&local_48);
        pCVar2 = owner;
        pBVar1 = this->fileDelegate;
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        vector(&local_88,
               (vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                *)local_70);
        (*pBVar1->_vptr_BuildFileDelegate[6])(pBVar1,pCVar2,&local_88);
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        ~vector(&local_88);
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        ~vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                 *)local_70);
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool establishOwnerships() {
    for (auto outputNodeAndCommand: outputNodesAndCommands) {
        if (outputNodeAndCommand.second->isExternalCommand() && outputNodeAndCommand.second->repairViaOwnershipAnalysis == true) {
          Command *owner = includedOwnerOf(outputNodeAndCommand.first->getName());
          if (owner == nullptr) {
            setOwner(outputNodeAndCommand.first, outputNodeAndCommand.second);
          } else if (owner == outputNodeAndCommand.second) {
            // A path and some of its subpaths are listed as output dependencies of a task.. Do nothing.
          } else {
            std::vector<Command*> conflictingProducers;
            conflictingProducers.push_back(outputNodeAndCommand.second);
            conflictingProducers.push_back(owner);
            fileDelegate.cannotLoadDueToMultipleProducers(outputNodeAndCommand.first, conflictingProducers);
            return false;
          }
        } else {
          setExcludedOwner(outputNodeAndCommand.first, outputNodeAndCommand.second);
        }
    }

    return true;
  }